

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall net_uv::Buffer::add(Buffer *this,char *pData,uint32_t dataLen)

{
  block *pbVar1;
  uint uVar2;
  block *pbVar3;
  uint uVar4;
  uint uVar5;
  
  for (; dataLen != 0; dataLen = dataLen - uVar2) {
    pbVar3 = this->m_tailBlock;
    uVar4 = pbVar3->dataLen;
    uVar5 = this->m_blockSize;
    if (uVar5 <= uVar4) {
      pbVar3 = createBlock(this);
      pbVar1 = this->m_tailBlock;
      pbVar1->next = pbVar3;
      pbVar3->pre = pbVar1;
      this->m_tailBlock = pbVar3;
      uVar5 = this->m_blockSize;
      uVar4 = pbVar3->dataLen;
    }
    uVar2 = uVar5 - uVar4;
    if (dataLen <= uVar5 - uVar4) {
      uVar2 = dataLen;
    }
    memcpy(pbVar3->data + uVar4,pData,(ulong)uVar2);
    this->m_tailBlock->dataLen = this->m_tailBlock->dataLen + uVar2;
    this->m_curDataLength = this->m_curDataLength + uVar2;
    pData = pData + uVar2;
  }
  return;
}

Assistant:

void add(char* pData, uint32_t dataLen)
	{
		char* curData = pData;
		while (dataLen > 0)
		{
			// create a new node
			if (m_tailBlock->dataLen >= m_blockSize)
			{
				block* b = createBlock();
				m_tailBlock->next = b;
				b->pre = m_tailBlock;
				m_tailBlock = b;
			}
			uint32_t sub = m_blockSize - m_tailBlock->dataLen;
			uint32_t copylen = (sub > dataLen) ? dataLen : sub;

			memcpy(m_tailBlock->data + m_tailBlock->dataLen, curData, copylen);

			m_tailBlock->dataLen += copylen;
			m_curDataLength += copylen;
			curData = curData + copylen;
			dataLen -= copylen;
		}
	}